

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O1

int OSSL::byteString2oid(ByteString *byteString)

{
  uchar *__s1;
  int iVar1;
  size_t sVar2;
  ASN1_OBJECT *o;
  ASN1_PRINTABLESTRING *pAVar3;
  uchar *p;
  int pclass;
  int tag;
  long length;
  uchar *pp;
  uchar *local_40;
  int local_38;
  int local_34;
  long local_30;
  uchar *local_28;
  
  local_40 = ByteString::const_byte_str(byteString);
  local_28 = local_40;
  sVar2 = ByteString::size(byteString);
  ASN1_get_object(&local_28,&local_30,&local_34,&local_38,sVar2);
  if (local_34 == 6 && local_38 == 0) {
    sVar2 = ByteString::size(byteString);
    o = d2i_ASN1_OBJECT((ASN1_OBJECT **)0x0,&local_40,sVar2);
    if (o == (ASN1_OBJECT *)0x0) {
      return 0;
    }
    iVar1 = OBJ_obj2nid(o);
    return iVar1;
  }
  if (local_38 == 0 && local_34 == 0x13) {
    sVar2 = ByteString::size(byteString);
    pAVar3 = d2i_ASN1_PRINTABLESTRING((ASN1_PRINTABLESTRING **)0x0,&local_40,sVar2);
    __s1 = pAVar3->data;
    iVar1 = strcmp((char *)__s1,"edwards25519");
    if (iVar1 == 0) {
      return 0x43f;
    }
    iVar1 = strcmp((char *)__s1,"curve25519");
    if (iVar1 == 0) {
      return 0x40a;
    }
    iVar1 = strcmp((char *)__s1,"edwards448");
    if (iVar1 == 0) {
      return 0x440;
    }
    iVar1 = strcmp((char *)__s1,"curve448");
    if (iVar1 == 0) {
      return 0x40b;
    }
  }
  return 0;
}

Assistant:

int OSSL::byteString2oid(const ByteString& byteString)
{
	ASN1_OBJECT *oid = NULL;
	ASN1_PRINTABLESTRING *curve_name = NULL;
	const unsigned char *p = byteString.const_byte_str();
	const unsigned char *pp = p;
	long length;
	int tag, pclass;

	ASN1_get_object(&pp, &length, &tag, &pclass, byteString.size());
	if (pclass == V_ASN1_UNIVERSAL && tag == V_ASN1_OBJECT)
	{
		/* The initial release of SoftHSM was expecting just OID value */
		oid = d2i_ASN1_OBJECT(NULL, &p, byteString.size());

		if (oid == NULL)
		{
			return NID_undef;
		}

		return OBJ_obj2nid(oid);
	}
	else if (pclass == V_ASN1_UNIVERSAL && tag == V_ASN1_PRINTABLESTRING)
	{
		/* The final PKCS#11 3.0 expects curve name encoded as PrintableString */
		curve_name = d2i_ASN1_PRINTABLESTRING(NULL, &p, byteString.size());

		if (strcmp((char *)curve_name->data, "edwards25519") == 0)
		{
			return EVP_PKEY_ED25519;
		}

		if (strcmp((char *)curve_name->data, "curve25519") == 0)
		{
			return EVP_PKEY_X25519;
		}

		if (strcmp((char *)curve_name->data, "edwards448") == 0)
		{
			return EVP_PKEY_ED448;
		}

		if (strcmp((char *)curve_name->data, "curve448") == 0)
		{
			return EVP_PKEY_X448;
		}
	}

	return NID_undef;
}